

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

string * __thiscall
flatbuffers::go::GoGenerator::WrapInNameSpaceAndTrack
          (string *__return_storage_ptr__,GoGenerator *this,Definition *def,string *name)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Definition *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_68 = def;
  iVar1 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])(this);
  if ((Namespace *)CONCAT44(extraout_var,iVar1) == def->defined_namespace) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::
    _Rb_tree<flatbuffers::Definition_const*,flatbuffers::Definition_const*,std::_Identity<flatbuffers::Definition_const*>,flatbuffers::go::GoGenerator::NamespacePtrLess,std::allocator<flatbuffers::Definition_const*>>
    ::_M_insert_unique<flatbuffers::Definition_const*const&>
              ((_Rb_tree<flatbuffers::Definition_const*,flatbuffers::Definition_const*,std::_Identity<flatbuffers::Definition_const*>,flatbuffers::go::GoGenerator::NamespacePtrLess,std::allocator<flatbuffers::Definition_const*>>
                *)&this->tracked_imported_namespaces_,&local_68);
    if ((local_68->defined_namespace->components).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_68->defined_namespace->components).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator+(&local_60,&local_68->name,".");
      std::operator+(__return_storage_ptr__,&local_60,name);
      this_00 = &local_60;
    }
    else {
      (*(this->namer_).super_Namer._vptr_Namer[10])(&local_40,&this->namer_);
      std::operator+(&local_60,&local_40,".");
      std::operator+(__return_storage_ptr__,&local_60,name);
      std::__cxx11::string::~string((string *)&local_60);
      this_00 = &local_40;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpaceAndTrack(const Definition *def,
                                      const std::string &name) {
    if (CurrentNameSpace() == def->defined_namespace) return name;
    tracked_imported_namespaces_.insert(def);
    if (def->defined_namespace->components.empty())
      return def->name + "." + name;
    else
      return NamespaceImportName(def->defined_namespace) + "." + name;
  }